

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

int av1_skip_u4x4_pred_in_obmc(BLOCK_SIZE bsize,macroblockd_plane *pd,int dir)

{
  BLOCK_SIZE BVar1;
  int in_EDX;
  long in_RSI;
  BLOCK_SIZE in_DIL;
  BLOCK_SIZE bsize_plane;
  undefined4 local_4;
  
  BVar1 = get_plane_block_size(in_DIL,*(int *)(in_RSI + 4),*(int *)(in_RSI + 8));
  if (BVar1 < BLOCK_8X8) {
    local_4 = (uint)(in_EDX == 0);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int av1_skip_u4x4_pred_in_obmc(BLOCK_SIZE bsize,
                               const struct macroblockd_plane *pd, int dir) {
  assert(is_motion_variation_allowed_bsize(bsize));

  const BLOCK_SIZE bsize_plane =
      get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
  switch (bsize_plane) {
#if DISABLE_CHROMA_U8X8_OBMC
    case BLOCK_4X4:
    case BLOCK_8X4:
    case BLOCK_4X8: return 1;
#else
    case BLOCK_4X4:
    case BLOCK_8X4:
    case BLOCK_4X8: return dir == 0;
#endif
    default: return 0;
  }
}